

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcdctmgr.c
# Opt level: O0

void jinit_forward_dct(j_compress_ptr cinfo)

{
  undefined8 *puVar1;
  long in_RDI;
  int i;
  my_fdct_ptr fdct;
  int local_14;
  
  puVar1 = (undefined8 *)(*(code *)**(undefined8 **)(in_RDI + 8))(in_RDI,1,0x138);
  *(undefined8 **)(in_RDI + 0x228) = puVar1;
  *puVar1 = start_pass_fdctmgr;
  for (local_14 = 0; local_14 < 4; local_14 = local_14 + 1) {
    puVar1[(long)local_14 + 0x15] = 0;
    puVar1[(long)local_14 + 0x23] = 0;
  }
  return;
}

Assistant:

GLOBAL(void)
jinit_forward_dct (j_compress_ptr cinfo)
{
  my_fdct_ptr fdct;
  int i;

  fdct = (my_fdct_ptr)
    (*cinfo->mem->alloc_small) ((j_common_ptr) cinfo, JPOOL_IMAGE,
				SIZEOF(my_fdct_controller));
  cinfo->fdct = (struct jpeg_forward_dct *) fdct;
  fdct->pub.start_pass = start_pass_fdctmgr;

  /* Mark divisor tables unallocated */
  for (i = 0; i < NUM_QUANT_TBLS; i++) {
    fdct->divisors[i] = NULL;
#ifdef DCT_FLOAT_SUPPORTED
    fdct->float_divisors[i] = NULL;
#endif
  }
}